

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O2

ON__UINT32 on_random_number(ON_RANDOM_NUMBER_CONTEXT *randcontext)

{
  uint uVar1;
  ON__UINT32 OVar2;
  uint uVar3;
  long lVar4;
  
  uVar1 = randcontext->mti;
  if ((ulong)uVar1 < 0x270) {
    uVar3 = randcontext->mt[uVar1];
    OVar2 = uVar1 + 1;
  }
  else {
    if (uVar1 != 0x270) {
      on_random_number_seed(0x1571,randcontext);
    }
    for (lVar4 = 0; lVar4 != 0xe3; lVar4 = lVar4 + 1) {
      randcontext->mt[lVar4] =
           on_random_number::mag01[randcontext->mt[lVar4 + 1] & 1] ^ randcontext->mt[lVar4 + 0x18d]
           ^ (randcontext->mt[lVar4 + 1] & 0x7ffffffe | randcontext->mt[lVar4] & 0x80000000) >> 1;
    }
    for (lVar4 = 0; lVar4 != 0x18c; lVar4 = lVar4 + 1) {
      randcontext->mt[lVar4 + 0xe3] =
           on_random_number::mag01[randcontext->mt[lVar4 + 0xe4] & 1] ^ randcontext->mt[lVar4] ^
           (randcontext->mt[lVar4 + 0xe4] & 0x7ffffffe | randcontext->mt[lVar4 + 0xe3] & 0x80000000)
           >> 1;
    }
    uVar3 = randcontext->mt[0];
    randcontext->mt[0x26f] =
         on_random_number::mag01[uVar3 & 1] ^ randcontext->mt[0x18c] ^
         (uVar3 & 0x7ffffffe | randcontext->mt[0x26f] & 0x80000000) >> 1;
    OVar2 = 1;
  }
  randcontext->mti = OVar2;
  uVar3 = uVar3 >> 0xb ^ uVar3;
  uVar3 = (uVar3 & 0x13a58ad) << 7 ^ uVar3;
  uVar3 = (uVar3 & 0x1df8c) << 0xf ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

ON__UINT32 on_random_number(struct ON_RANDOM_NUMBER_CONTEXT* randcontext)
{
  static const ON__UINT32 mag01[2]={0x0UL, MATRIX_A};
  ON__UINT32 kk, y;
  /* mag01[x] = x * MATRIX_A  for x=0,1 */

  if (randcontext->mti >= N) 
  {
    /* generate N words at one time */
    if (randcontext->mti >= N+1)
    {
      /* if randcontext has never been initialized */
      on_random_number_seed(5489UL,randcontext); /* a default initial seed is used */
    }

    for (kk=0;kk<N-M;kk++)
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+M] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    for (;kk<N-1;kk++) 
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+(M-N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    y = (randcontext->mt[N-1]&UPPER_MASK)|(randcontext->mt[0]&LOWER_MASK);
    randcontext->mt[N-1] = randcontext->mt[M-1] ^ (y >> 1) ^ mag01[y & 0x1UL];

    randcontext->mti = 0;
  }

  y = randcontext->mt[randcontext->mti++];

  /* Tempering */
  y ^= (y >> 11);
  y ^= (y << 7) & 0x9d2c5680UL;
  y ^= (y << 15) & 0xefc60000UL;
  y ^= (y >> 18);

  return y;
}